

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void __thiscall leveldb::log::LogTest_ReadError_Test::TestBody(LogTest_ReadError_Test *this)

{
  AssertionResult *pAVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar2;
  AssertionResult *message;
  allocator local_69;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  
  std::__cxx11::string::string((string *)&gtest_ar_1,"foo",(allocator *)&gtest_ar);
  LogTest::Write(&this->super_LogTest,(string *)&gtest_ar_1);
  std::__cxx11::string::_M_dispose();
  (this->super_LogTest).source_.force_error_ = true;
  LogTest::Read_abi_cxx11_((string *)&gtest_ar_1,&this->super_LogTest);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"EOF\"","Read()",(char (*) [4])"EOF",(string *)&gtest_ar_1);
  std::__cxx11::string::_M_dispose();
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pAVar1 = &gtest_ar;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
               ,0x171,pcVar2);
    message = &gtest_ar_1;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_8_ = (this->super_LogTest).report_.dropped_bytes_;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar_1,"kBlockSize","DroppedBytes()",&kBlockSize,
               (unsigned_long *)&gtest_ar);
    if (gtest_ar_1.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      std::__cxx11::string::string((string *)&gtest_ar,"read error",&local_69);
      LogTest::MatchError((string *)&gtest_ar_1,&this->super_LogTest,(string *)&gtest_ar);
      testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                ((internal *)&gtest_ar_2,"\"OK\"","MatchError(\"read error\")",(char (*) [3])"OK",
                 (string *)&gtest_ar_1);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
                   ,0x173,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
        if ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
        }
      }
      this_00 = &gtest_ar_2.message_;
      goto LAB_0010dc17;
    }
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pAVar1 = &gtest_ar_1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
               ,0x172,pcVar2);
    message = &gtest_ar;
  }
  this_00 = &pAVar1->message_;
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
  if (*(long **)message != (long *)0x0) {
    (**(code **)(**(long **)message + 8))();
  }
LAB_0010dc17:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

TEST_F(LogTest, ReadError) {
  Write("foo");
  ForceError();
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(kBlockSize, DroppedBytes());
  ASSERT_EQ("OK", MatchError("read error"));
}